

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

bool __thiscall
libmatroska::KaxInternalBlock::AddFrame
          (KaxInternalBlock *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          LacingType lacing,bool invisible)

{
  uint16 uVar1;
  int iVar2;
  EbmlUInteger *this_00;
  undefined4 extraout_var;
  bool bVar3;
  DataBuffer *local_30;
  
  (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = true;
  if ((this->myBuffers).
      super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->myBuffers).
      super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this->Timecode = timecode;
    this_00 = (EbmlUInteger *)
              libebml::EbmlMaster::FindElt
                        (&track->super_EbmlMaster,(EbmlCallbacks *)KaxTrackNumber::ClassInfos);
    uVar1 = libebml::EbmlUInteger::operator_cast_to_unsigned_short(this_00);
    this->TrackNumber = uVar1;
    this->mInvisible = invisible;
    this->mLacing = lacing;
  }
  local_30 = buffer;
  std::vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>>::
  emplace_back<libmatroska::DataBuffer*>
            ((vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)
             &this->myBuffers,&local_30);
  bVar3 = false;
  if (((lacing != LACING_NONE) &&
      (bVar3 = false,
      (ulong)((long)(this->myBuffers).
                    super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->myBuffers).
                   super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x39)) &&
     (bVar3 = true, lacing == LACING_XIPH)) {
    iVar2 = (*buffer->_vptr_DataBuffer[3])(buffer);
    bVar3 = *(uint *)CONCAT44(extraout_var,iVar2) < 0x5fa;
  }
  return bVar3;
}

Assistant:

bool KaxInternalBlock::AddFrame(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, LacingType lacing, bool invisible)
{
  SetValueIsSet();
  if (myBuffers.size() == 0) {
    // first frame
    Timecode = timecode;
    TrackNumber = track.TrackNumber();
    mInvisible = invisible;
    mLacing = lacing;
  }
  myBuffers.push_back(&buffer);

  // we don't allow more than 8 frames in a Block because the overhead improvement is minimal
  if (myBuffers.size() >= 8 || lacing == LACING_NONE)
    return false;

  if (lacing == LACING_XIPH)
    // decide wether a new frame can be added or not
    // a frame in a lace is not efficient when the place necessary to code it in a lace is bigger
    // than the size of a simple Block. That means more than 6 bytes (4 in struct + 2 for EBML) to code the size
    return (buffer.Size() < 6*0xFF);
  else
    return true;
}